

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long *__dest;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  long *plVar12;
  long lVar13;
  uint uVar14;
  int i;
  ulong uVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [12];
  allocator local_662;
  allocator local_661;
  string message;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  GGWave ggWave;
  
  printf("Usage: %s [-p] [-b] [-tN] [-lN]\n",*argv);
  puts("    -p  - print tones, no playback");
  puts("    -A  - print Arduino code");
  puts("    -b  - use \'beep\' command");
  puts("    -s  - use Direct Sequence Spread (DSS)");
  puts("    -tN - transmission protocol");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  putchar(10);
  __dest = (long *)GGWave::Protocols::tx();
  memcpy(__dest,&PTR_anon_var_dwarf_278d_00104c18,0x160);
  parseCmdArguments_abi_cxx11_((int)&argm,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string((string *)&ggWave,"p",(allocator *)&message);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&argm,(key_type *)&ggWave);
  std::__cxx11::string::~string((string *)&ggWave);
  std::__cxx11::string::string((string *)&ggWave,"A",(allocator *)&message);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&argm,(key_type *)&ggWave);
  std::__cxx11::string::~string((string *)&ggWave);
  std::__cxx11::string::string((string *)&ggWave,"b",(allocator *)&message);
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&argm,(key_type *)&ggWave);
  std::__cxx11::string::~string((string *)&ggWave);
  std::__cxx11::string::string((string *)&ggWave,"s",(allocator *)&message);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::count(&argm,(key_type *)&ggWave);
  std::__cxx11::string::~string((string *)&ggWave);
  std::__cxx11::string::string((string *)&ggWave,"t",&local_661);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::count(&argm,(key_type *)&ggWave);
  uVar14 = 0;
  if (sVar10 != 0) {
    std::__cxx11::string::string((string *)&message,"t",&local_662);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&argm,&message);
    uVar14 = std::__cxx11::stoi(pmVar11,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&message);
  }
  std::__cxx11::string::~string((string *)&ggWave);
  std::__cxx11::string::string((string *)&ggWave,"l",&local_661);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::count(&argm,(key_type *)&ggWave);
  if (sVar10 == 0) {
    uVar4 = 0x10;
  }
  else {
    std::__cxx11::string::string((string *)&message,"l",&local_662);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&argm,&message);
    uVar4 = std::__cxx11::stoi(pmVar11,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&message);
  }
  std::__cxx11::string::~string((string *)&ggWave);
  message._M_dataplus._M_p._4_4_ = 0x473b8000;
  message._M_string_length._0_4_ = 0x473b8000;
  message._M_string_length._4_4_ = 0x473b8000;
  message.field_2._M_allocated_capacity._0_4_ = 0x400;
  message.field_2._4_8_ = 0x540400000;
  message.field_2._12_4_ = 5;
  message._M_dataplus._M_p._0_4_ = uVar4;
  GGWave::GGWave(&ggWave,(ggwave_Parameters *)&message);
  puts("Available Tx protocols:");
  plVar12 = __dest;
  for (uVar15 = 0; uVar15 != 0x16; uVar15 = uVar15 + 1) {
    if ((*(char *)((long)plVar12 + 0xd) == '\x01') && (*plVar12 != 0)) {
      printf("    -t%-2d : %-16s\n",uVar15 & 0xffffffff);
    }
    plVar12 = plVar12 + 2;
  }
  putchar(10);
  if (uVar14 < 0x16) {
    printf("Selecting Tx protocol %d\n",(ulong)uVar14);
    if ((sVar8 == 0 && sVar7 == 0) && sVar9 == 0) {
      iVar6 = 1;
      iVar5 = ioctl(1,0x4b30,0);
      if ((iVar5 != 0) && (iVar6 = open("/dev/tty0",0), iVar6 < 0)) {
        perror("/dev/tty0");
        fwrite("This program must be run as root\n",0x21,1,_stderr);
        iVar6 = 1;
        goto LAB_00102830;
      }
    }
    else {
      iVar6 = 1;
    }
    fwrite("Enter a text message:\n",0x16,1,_stderr);
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length._0_4_ = 0;
    message._M_string_length._4_4_ = 0;
    message.field_2._M_allocated_capacity._0_4_ =
         message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&message);
    putchar(10);
    if ((char *)CONCAT44(message._M_string_length._4_4_,(int)message._M_string_length) ==
        (char *)0x0) {
      fwrite("Invalid message: size = 0\n",0x1a,1,_stderr);
      iVar6 = -2;
    }
    else if ((int)uVar4 < (int)message._M_string_length) {
      fprintf(_stderr,"Invalid message: size > %d\n",(ulong)uVar4);
      iVar6 = -3;
    }
    else {
      GGWave::init((int)&ggWave,
                   (char *)CONCAT44(message._M_string_length._4_4_,(int)message._M_string_length),
                   (ggwave_ProtocolId)message._M_dataplus._M_p,uVar14);
      GGWave::encode();
      auVar18 = GGWave::txTones();
      iVar5 = GGWave::samplesPerFrame();
      fVar16 = (float)GGWave::sampleRateOut();
      cVar1 = *(char *)((long)__dest + (ulong)uVar14 * 0x10 + 10);
      for (lVar13 = 0; auVar18._8_4_ != lVar13; lVar13 = lVar13 + 1) {
        lVar3 = __dest[(ulong)uVar14 * 2 + 1];
        cVar2 = *(char *)(auVar18._0_8_ + lVar13);
        fVar17 = (float)GGWave::hzPerSample();
        processTone(iVar6,(double)(fVar17 * (float)((int)cVar2 + (int)(short)lVar3)),
                    (long)(int)((((float)iVar5 * 1000.0) / fVar16) * (float)(int)cVar1),sVar9 != 0,
                    sVar7 != 0,sVar8 != 0);
      }
      iVar6 = 0;
    }
    std::__cxx11::string::~string((string *)&message);
  }
  else {
    fprintf(_stderr,"Unknown Tx protocol %d\n",(ulong)uVar14);
    iVar6 = -3;
LAB_00102830:
  }
  GGWave::~GGWave(&ggWave);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&argm);
  return iVar6;
}

Assistant:

int main(int argc, char** argv) {
    printf("Usage: %s [-p] [-b] [-tN] [-lN]\n", argv[0]);
    printf("    -p  - print tones, no playback\n");
    printf("    -A  - print Arduino code\n");
    printf("    -b  - use 'beep' command\n");
    printf("    -s  - use Direct Sequence Spread (DSS)\n");
    printf("    -tN - transmission protocol\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");

    auto & protocols = GGWave::Protocols::tx();
    protocols = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm         = parseCmdArguments(argc, argv);
    const bool printTones   = argm.count("p") > 0;
    const bool printArduino = argm.count("A") > 0;
    const bool useBeep      = argm.count("b") > 0;
    const bool useDSS       = argm.count("s") > 0;
    const int txProtocolId  = argm.count("t") == 0 ? 0 : std::stoi(argm.at("t"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_TX | GGWAVE_OPERATING_MODE_TX_ONLY_TONES;
    if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

    GGWave ggWave({
        payloadLength,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSamplesPerFrame,
        GGWave::kDefaultSoundMarkerThreshold,
        GGWAVE_SAMPLE_FORMAT_F32,
        GGWAVE_SAMPLE_FORMAT_F32,
        mode,
    });

    printf("Available Tx protocols:\n");
    for (int i = 0; i < (int) protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled && protocol.name) {
            printf("    -t%-2d : %-16s\n", i, protocol.name);
        }
    }
    printf("\n");

    if (txProtocolId < 0 || txProtocolId >= (int) protocols.size()) {
        fprintf(stderr, "Unknown Tx protocol %d\n", txProtocolId);
        return -3;
    }

    printf("Selecting Tx protocol %d\n", txProtocolId);

    int fd = 1;
    if (useBeep == false && printTones == false && printArduino == false) {
        if (ioctl(fd, KDMKTONE, 0)) {
            fd = open(CONSOLE, O_RDONLY);
        }
        if (fd < 0) {
            perror(CONSOLE);
            fprintf(stderr, "This program must be run as root\n");
            return 1;
        }
    }

    fprintf(stderr, "Enter a text message:\n");

    std::string message;
    std::getline(std::cin, message);

    printf("\n");

    if (message.size() == 0) {
        fprintf(stderr, "Invalid message: size = 0\n");
        return -2;
    }

    if ((int) message.size() > payloadLength) {
        fprintf(stderr, "Invalid message: size > %d\n", payloadLength);
        return -3;
    }

    ggWave.init(message.size(), message.data(), GGWave::TxProtocolId(txProtocolId), 10);
    ggWave.encode();

    const auto & protocol = protocols[txProtocolId];
    const auto tones = ggWave.txTones();
    const auto duration_ms = protocol.txDuration_ms(ggWave.samplesPerFrame(), ggWave.sampleRateOut());
    for (auto & tone : tones) {
        const auto freq_hz = (protocol.freqStart + tone)*ggWave.hzPerSample();
        processTone(fd, freq_hz, duration_ms, useBeep, printTones, printArduino);
    }

    return 0;
}